

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcache_bin_flush_large
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,uint rem)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  ticker_geom_t *ptVar3;
  long *plVar4;
  char cVar5;
  uint64_t uVar6;
  edata_t *peVar7;
  tsd_t *tsdn;
  int iVar8;
  ulong uVar9;
  undefined8 *nflush;
  undefined8 *puVar10;
  uint i;
  arena_t *paVar11;
  ulong uVar12;
  ulong uVar13;
  void **ppvVar14;
  uint uVar15;
  uint uVar16;
  emap_batch_lookup_result_t *edatas;
  arena_t *paVar17;
  cache_bin_ptr_array_t local_b8;
  arena_t *local_a8;
  cache_bin_t *local_a0;
  arena_t *local_98;
  long local_90;
  arena_stats_large_t *lstats;
  tcache_t *local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  tsd_t *local_60;
  ulong local_58;
  long local_50;
  int local_44;
  undefined8 *local_40;
  uint local_34;
  
  edatas = (emap_batch_lookup_result_t *)0x0;
  local_80 = tcache;
  duckdb_je_tcache_bin_flush_stashed(tsd,tcache,cache_bin,binind,false);
  uVar16 = *(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head & 0xffff;
  uVar15 = uVar16 >> 3;
  if (uVar15 < (rem & 0xffff)) {
    rem = uVar15;
  }
  uVar15 = uVar15 - rem & 0xffff;
  uVar12 = (ulong)uVar15;
  local_78 = (long)cache_bin->stack_head + ((ulong)uVar16 - (ulong)(uVar15 * 8));
  uVar15 = 0;
  local_50 = ((ulong)binind - 0x24) * 0x30;
  lstats = (arena_stats_large_t *)&local_b8;
  local_a0 = cache_bin;
  local_68 = uVar12;
  local_60 = tsd;
  do {
    uVar16 = (uint)uVar12 - uVar15;
    if (0xff < uVar16) {
      uVar16 = 0x100;
    }
    local_58 = (ulong)uVar16;
    local_b8.n = (cache_bin_sz_t)uVar16;
    local_b8.ptr = (void **)(local_78 + (ulong)uVar15 * 8);
    paVar11 = local_80->tcache_slow->arena;
    nflush = (undefined8 *)((long)lstats - (ulong)(uVar16 * 8 + 0x17 & 0x1ff0));
    local_40 = nflush;
    nflush[-1] = 0x1c62ca2;
    tcache_bin_flush_edatas_lookup(tsd,&local_b8,uVar16,(size_t)nflush,edatas);
    if ((uint)uVar12 == uVar15) {
LAB_01c62f1d:
      LOCK();
      plVar4 = (long *)((long)&(paVar11->stats).lstats[0].nrequests.val.repr + local_50);
      *plVar4 = *plVar4 + (cache_bin->tstats).nrequests;
      UNLOCK();
      LOCK();
      plVar4 = (long *)((long)&(paVar11->stats).lstats[0].nflushes.val.repr + local_50);
      *plVar4 = *plVar4 + 1;
      UNLOCK();
      (cache_bin->tstats).nrequests = 0;
    }
    else {
      local_90 = (long)&(paVar11->stats).lstats[0].nmalloc.val.repr + local_50;
      local_34 = 0;
      uVar12 = local_58 & 0xffffffff;
      puVar10 = local_40;
      local_a8 = paVar11;
      local_70 = (ulong)uVar15;
      do {
        local_44 = (int)uVar12;
        uVar15 = *(uint *)*puVar10 & 0xfff;
        paVar17 = (arena_t *)duckdb_je_arenas[uVar15].repr;
        if (paVar17 == (arena_t *)0x0) {
          paVar17 = (arena_t *)0x0;
        }
        if (duckdb_je_manual_arena_base <= paVar17->ind) {
          nflush[-1] = 0x1c62d23;
          iVar8 = pthread_mutex_trylock
                            ((pthread_mutex_t *)((long)&(paVar17->large_mtx).field_0 + 0x48));
          if (iVar8 != 0) {
            nflush[-1] = 0x1c62d33;
            duckdb_je_malloc_mutex_lock_slow(&paVar17->large_mtx);
            (paVar17->large_mtx).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(paVar17->large_mtx).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          puVar10 = local_40;
          if (&((paVar17->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            *(tsd_t **)((long)&(paVar17->large_mtx).field_0 + 0x30) = tsd;
            ppwVar2 = &(paVar17->large_mtx).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
        }
        if ((paVar11 == paVar17) && ((local_34 & 1) == 0)) {
          uVar6 = (cache_bin->tstats).nrequests;
          LOCK();
          *(long *)(local_90 + 0x10) = *(long *)(local_90 + 0x10) + uVar6;
          UNLOCK();
          LOCK();
          *(long *)(local_90 + 0x20) = *(long *)(local_90 + 0x20) + 1;
          UNLOCK();
          (cache_bin->tstats).nrequests = 0;
          local_34 = (uint)CONCAT71((int7)(uVar6 >> 8),1);
        }
        uVar9 = (ulong)(local_44 + (uint)(local_44 == 0));
        uVar12 = 0;
        do {
          peVar7 = (edata_t *)puVar10[uVar12];
          if (((uint)peVar7->e_bits & 0xfff) == uVar15) {
            nflush[-1] = 0x1c62db3;
            duckdb_je_large_dalloc_prep_locked((tsdn_t *)tsd,peVar7);
            puVar10 = local_40;
          }
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
        if (duckdb_je_manual_arena_base <= paVar17->ind) {
          (paVar17->large_mtx).field_0.field_0.locked.repr = false;
          nflush[-1] = 0x1c62de5;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&(paVar17->large_mtx).field_0 + 0x48));
          puVar10 = local_40;
        }
        ppvVar14 = local_b8.ptr;
        uVar13 = 0;
        uVar12 = 0;
        local_98 = paVar17;
        do {
          tsdn = local_60;
          peVar7 = (edata_t *)puVar10[uVar13];
          if (((uint)peVar7->e_bits & 0xfff) == uVar15) {
            nflush[-1] = 0x1c62e17;
            duckdb_je_large_dalloc_finish((tsdn_t *)tsdn,peVar7);
            puVar10 = local_40;
          }
          else {
            ppvVar14[uVar12] = ppvVar14[uVar13];
            puVar10[uVar12] = peVar7;
            uVar12 = (ulong)((int)uVar12 + 1);
          }
          tsd = local_60;
          paVar17 = local_98;
          cache_bin = local_a0;
          paVar11 = local_a8;
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
        if (local_60 != (tsd_t *)0x0) {
          cVar5 = local_60->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
          ptVar3 = &local_60->
                    cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
          ptVar3->tick = ptVar3->tick + ((int)uVar12 - local_44);
          if (ptVar3->tick < 0) {
            if (cVar5 < '\x01') {
              uVar9 = local_60->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                      0x5851f42d4c957f2d + 0x14057b7ef767814f;
              local_60->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar9;
              (local_60->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).
              tick = (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar9 >> 0x3a] *
                               (long)(local_60->
                                     cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                     ).nticks) / 0x3d);
              nflush[-1] = 0x1c62f03;
              duckdb_je_arena_decay((tsdn_t *)tsd,paVar17,false,false);
              puVar10 = local_40;
            }
            else {
              (local_60->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).
              tick = 0;
            }
          }
        }
      } while ((int)uVar12 != 0);
      uVar15 = (uint)local_70;
      uVar12 = local_68;
      if ((local_34 & 1) == 0) goto LAB_01c62f1d;
    }
    uVar15 = (int)local_58 + uVar15;
    uVar16 = (uint)uVar12;
    if (uVar16 <= uVar15) {
      ppvVar14 = cache_bin->stack_head;
      iVar8 = *(int *)&cache_bin->low_bits_empty;
      lstats[-1].curlextents = 0x1c62f80;
      memmove((void *)((long)ppvVar14 + (ulong)(uVar16 * 8)),ppvVar14,
              (ulong)(((iVar8 - (int)ppvVar14 & 0xffffU) >> 3) - uVar16) << 3);
      ppvVar14 = (void **)((ulong)(uVar16 * 8) + (long)cache_bin->stack_head);
      cache_bin->stack_head = ppvVar14;
      if ((ushort)((*(int *)&cache_bin->low_bits_empty - (int)ppvVar14 & 0xffffU) >> 3) <
          (ushort)((short)*(int *)&cache_bin->low_bits_empty - cache_bin->low_bits_low_water) >> 3)
      {
        cache_bin->low_bits_low_water = (uint16_t)ppvVar14;
      }
      return;
    }
  } while( true );
}

Assistant:

void
tcache_bin_flush_large(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, unsigned rem) {
	tcache_bin_flush_bottom(tsd, tcache, cache_bin, binind, rem,
	    /* small */ false);
}